

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandline.cpp
# Opt level: O2

void __thiscall CommandLine::~CommandLine(CommandLine *this)

{
  _Elt_pointer ppCVar1;
  List<CommandLineOption_*> *__range1;
  _Elt_pointer ppCVar2;
  _Elt_pointer ppCVar3;
  _Map_pointer pppCVar4;
  
  ppCVar3 = (this->_options)._deque.
            super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppCVar2 = (this->_options)._deque.
            super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_last;
  pppCVar4 = (this->_options)._deque.
             super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  ppCVar1 = (this->_options)._deque.
            super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  while (ppCVar3 != ppCVar1) {
    if (*ppCVar3 != (CommandLineOption *)0x0) {
      (*(*ppCVar3)->_vptr_CommandLineOption[1])();
    }
    ppCVar3 = ppCVar3 + 1;
    if (ppCVar3 == ppCVar2) {
      ppCVar3 = pppCVar4[1];
      pppCVar4 = pppCVar4 + 1;
      ppCVar2 = ppCVar3 + 0x40;
    }
  }
  std::_Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>::~_Deque_base
            ((_Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_> *)this);
  return;
}

Assistant:

CommandLine::~CommandLine()
{
	for (CommandLineOption* opt : _options)
		delete opt;
}